

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertEqualMemory
               (void *expected,void *actual,UNITY_UINT32 length,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  int iVar1;
  UNITY_UINT32 UVar2;
  UNITY_UINT32 local_48;
  UNITY_UINT32 local_44;
  UNITY_UINT32 bytes;
  UNITY_UINT32 elements;
  uchar *ptr_act;
  uchar *ptr_exp;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  UNITY_UINT32 num_elements_local;
  UNITY_UINT32 length_local;
  void *actual_local;
  void *expected_local;
  
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    if ((num_elements == 0) || (length == 0)) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if (expected != actual) {
      iVar1 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      local_44 = num_elements;
      _bytes = (byte *)actual;
      ptr_act = (uchar *)expected;
      if (iVar1 != 0) {
        Unity.CurrentTestFailed = 1;
        longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
      }
      while (UVar2 = local_44 - 1, local_48 = length, local_44 != 0) {
        while (local_48 != 0) {
          if (*ptr_act != *_bytes) {
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(" Memory Mismatch.");
            if (1 < num_elements) {
              UnityPrint(" Element ");
              UnityPrintNumberUnsigned((ulong)((num_elements - UVar2) - 1));
            }
            UnityPrint(" Byte ");
            UnityPrintNumberUnsigned((ulong)((length - (local_48 - 1)) - 1));
            UnityPrint(" Expected ");
            UnityPrintNumberByStyle((ulong)*ptr_act,UNITY_DISPLAY_STYLE_HEX8);
            UnityPrint(" Was ");
            UnityPrintNumberByStyle((ulong)*_bytes,UNITY_DISPLAY_STYLE_HEX8);
            UnityAddMsgIfSpecified(msg);
            Unity.CurrentTestFailed = 1;
            longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
          }
          ptr_act = ptr_act + 1;
          _bytes = _bytes + 1;
          local_48 = local_48 - 1;
        }
        local_44 = UVar2;
        if (flags == UNITY_ARRAY_TO_VAL) {
          ptr_act = (uchar *)expected;
        }
      }
    }
  }
  return;
}

Assistant:

void UnityAssertEqualMemory(UNITY_INTERNAL_PTR expected,
                            UNITY_INTERNAL_PTR actual,
                            const UNITY_UINT32 length,
                            const UNITY_UINT32 num_elements,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber,
                            const UNITY_FLAGS_T flags)
{
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_act = (UNITY_PTR_ATTRIBUTE const unsigned char*)actual;
    UNITY_UINT32 elements = num_elements;
    UNITY_UINT32 bytes;

    RETURN_IF_FAIL_OR_IGNORE;

    if ((elements == 0) || (length == 0))
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual) return; /* Both are NULL or same pointer */
    if (UnityIsOneArrayNull(expected, actual, lineNumber, msg))
        UNITY_FAIL_AND_BAIL;

    while (elements--)
    {
        bytes = length;
        while (bytes--)
        {
            if (*ptr_exp != *ptr_act)
            {
                UnityTestResultsFailBegin(lineNumber);
                UnityPrint(UnityStrMemory);
                if (num_elements > 1)
                {
                    UnityPrint(UnityStrElement);
                    UnityPrintNumberUnsigned(num_elements - elements - 1);
                }
                UnityPrint(UnityStrByte);
                UnityPrintNumberUnsigned(length - bytes - 1);
                UnityPrint(UnityStrExpected);
                UnityPrintNumberByStyle(*ptr_exp, UNITY_DISPLAY_STYLE_HEX8);
                UnityPrint(UnityStrWas);
                UnityPrintNumberByStyle(*ptr_act, UNITY_DISPLAY_STYLE_HEX8);
                UnityAddMsgIfSpecified(msg);
                UNITY_FAIL_AND_BAIL;
            }
            ptr_exp++;
            ptr_act++;
        }
        if (flags == UNITY_ARRAY_TO_VAL)
        {
            ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
        }
    }
}